

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqResWithDeletion.cpp
# Opt level: O0

void __thiscall Shell::EqResWithDeletionExtra::output(EqResWithDeletionExtra *this,ostream *out)

{
  bool bVar1;
  reference ppLVar2;
  ostream *poVar3;
  ostream *in_RSI;
  long in_RDI;
  Literal *l;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<Kernel::Literal_*,_std::hash<Kernel::Literal_*>,_std::equal_to<Kernel::Literal_*>,_std::allocator<Kernel::Literal_*>_>
  *__range1;
  bool first;
  Literal *in_stack_000001e8;
  unordered_set<Kernel::Literal_*,_std::hash<Kernel::Literal_*>,_std::equal_to<Kernel::Literal_*>,_std::allocator<Kernel::Literal_*>_>
  *in_stack_ffffffffffffff78;
  string *this_00;
  string local_58 [32];
  value_type local_38;
  _Node_iterator_base<Kernel::Literal_*,_false> local_30;
  _Node_iterator_base<Kernel::Literal_*,_false> local_28;
  long local_20;
  byte local_11;
  ostream *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  std::operator<<(in_RSI,"resolved=[");
  local_20 = in_RDI + 8;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<Kernel::Literal_*,_std::hash<Kernel::Literal_*>,_std::equal_to<Kernel::Literal_*>,_std::allocator<Kernel::Literal_*>_>
       ::begin(in_stack_ffffffffffffff78);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<Kernel::Literal_*,_std::hash<Kernel::Literal_*>,_std::equal_to<Kernel::Literal_*>,_std::allocator<Kernel::Literal_*>_>
       ::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppLVar2 = std::__detail::_Node_const_iterator<Kernel::Literal_*,_true,_false>::operator*
                        ((_Node_const_iterator<Kernel::Literal_*,_true,_false> *)0xb8a995);
    local_38 = *ppLVar2;
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,",");
    }
    local_11 = 0;
    poVar3 = std::operator<<(local_10,"(");
    this_00 = local_58;
    Kernel::Literal::toString_abi_cxx11_(in_stack_000001e8);
    poVar3 = std::operator<<(poVar3,this_00);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string(local_58);
    std::__detail::_Node_const_iterator<Kernel::Literal_*,_true,_false>::operator++
              ((_Node_const_iterator<Kernel::Literal_*,_true,_false> *)this_00);
  }
  std::operator<<(local_10,"]");
  return;
}

Assistant:

void EqResWithDeletionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "resolved=[";
  for(Literal *l : resolved) {
    if(!first)
      out << ",";
    first = false;
    out << "(" << l->toString() << ")";
  }
  out << "]";

}